

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmGen12TextureCalc::GetMipTailByteOffset
          (GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  Context *pCVar1;
  uint32_t uVar2;
  
  pCVar1 = (this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
           super_GmmTextureCalc.pGmmLibContext;
  if (((uint)(pCVar1->SkuTable).field_0 & 0x40) != 0) {
    uVar2 = GmmGen11TextureCalc::GetMipTailByteOffset
                      (&this->super_GmmGen11TextureCalc,pTexInfo,MipLevel);
    return uVar2;
  }
  if (((pCVar1->SkuTable).field_1.field_0x1 & 0x80) == 0) {
    uVar2 = GmmGen9TextureCalc::GetMipTailByteOffset((GmmGen9TextureCalc *)this,pTexInfo,MipLevel);
    return uVar2;
  }
  return 0;
}

Assistant:

uint32_t GmmLib::GmmGen12TextureCalc::GetMipTailByteOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                           uint32_t          MipLevel)
{
    uint32_t ByteOffset = 0, Slot = 0xff;

    GMM_DPF_ENTER;

    if(pGmmLibContext->GetSkuTable().FtrTileY)
    {
        return GmmGen11TextureCalc::GetMipTailByteOffset(pTexInfo, MipLevel);
    }
    // 3D textures follow the Gen10 mip tail format
    if(!pGmmLibContext->GetSkuTable().FtrStandardMipTailFormat)
    {
        return GmmGen9TextureCalc::GetMipTailByteOffset(pTexInfo, MipLevel);
    }

    // Til64 is the only format which supports MipTail on FtrTileY disabled platforms
    __GMM_ASSERT(pTexInfo->Flags.Info.Tile64);
    // Mipped MSAA is not supported for Tile64
    __GMM_ASSERT(pTexInfo->MSAA.NumSamples <= 1);

    if((pTexInfo->Type == RESOURCE_1D) || (pTexInfo->Type == RESOURCE_3D) || (pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE))
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod;
    }

    // Miptail Slot layout in Tile64: as per specifications
    // Byteoffset varies based on bpp for tile64 format, so any caller who needs to use byteoffset needs to call cpuswizzle with corresponding geomteric offsets
    // Returning ByteOffset as 0 for Tile64 always

    // GMM_DPF_CRITICAL("Miptail byte offset requested for Tile64 \r\n");
    GMM_DPF_EXIT;

    // return ByteOffset=0, i.e return start of miptail for any address within packed miptail
    return (ByteOffset);
}